

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O2

string * cmSearchPathStripBin(string *__return_storage_ptr__,string *s)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_60,(string *)s);
  bVar1 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(&local_60,(char (*) [5])0x49c1d9);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,(string *)s);
    bVar1 = cmHasLiteralSuffix<std::__cxx11::string,6ul>(&local_40,(char (*) [6])0x49c1c0);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    if (!bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
      return __return_storage_ptr__;
    }
  }
  cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,s);
  return __return_storage_ptr__;
}

Assistant:

static std::string cmSearchPathStripBin(std::string const& s)
{
  // If the path is a PREFIX/bin case then add its parent instead.
  if((cmHasLiteralSuffix(s, "/bin")) ||
     (cmHasLiteralSuffix(s, "/sbin")))
    {
    return cmSystemTools::GetFilenamePath(s);
    }
  else
    {
    return s;
    }
}